

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddVMRangeForVMAddr
          (RangeSink *this,char *analyzer,uint64_t label_from_vmaddr,uint64_t addr,uint64_t size)

{
  string_view format;
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Arg *in_RDI;
  undefined8 in_R8;
  uint64_t in_stack_00000008;
  uint64_t in_stack_00000010;
  RangeSink *in_stack_00000018;
  bool ok;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  bool verbose;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  DataSource in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  string *this_00;
  Arg *in_stack_fffffffffffffec0;
  Arg *in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed0 [15];
  undefined1 in_stack_fffffffffffffedf;
  RangeMap *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  uint64_t in_stack_fffffffffffffef0;
  uint64_t in_stack_fffffffffffffef8;
  RangeMap *in_stack_ffffffffffffff00;
  RangeMap *in_stack_ffffffffffffff10;
  string local_a0 [35];
  undefined1 local_7d;
  string local_70 [32];
  reference local_50;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *local_48;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_40;
  char **local_38;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_29 = IsVerboseForVMRange(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  if ((bool)local_29) {
    pcVar2 = GetDataSourceLabel(in_stack_fffffffffffffe94);
    printf("[%s, %s] AddVMRangeForVMAddr(%lx, [%lx, %lx])\n",pcVar2,local_10,local_18,local_20,
           local_28);
  }
  if (in_RDI[5].piece_._M_len == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x4f1,
                  "void bloaty::RangeSink::AddVMRangeForVMAddr(const char *, uint64_t, uint64_t, uint64_t)"
                 );
  }
  local_38 = &in_RDI[5].piece_._M_str;
  local_40._M_current =
       (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
       std::
       vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                *)in_stack_fffffffffffffe88);
  local_48 = (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
             std::
             vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                    *)in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffe88), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
               ::operator*(&local_40);
    this_00 = local_70;
    std::__cxx11::string::string(this_00);
    bVar1 = RangeMap::TryGetLabel
                      ((RangeMap *)this_00,
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe98);
    if (bVar1) {
      in_stack_fffffffffffffe88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &local_50->first->file_map;
      in_stack_fffffffffffffea7 =
           RangeMap::AddRangeWithTranslation
                     (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                      (bool)in_stack_fffffffffffffedf,in_stack_ffffffffffffff10);
      local_7d = in_stack_fffffffffffffea7;
      if (((!(bool)in_stack_fffffffffffffea7) && (1 < verbose_level)) && (0 < verbose_level)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   (char *)in_stack_fffffffffffffe98);
        absl::substitute_internal::Arg::Arg
                  ((Arg *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   (unsigned_long)in_stack_fffffffffffffe98);
        absl::substitute_internal::Arg::Arg
                  ((Arg *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   (unsigned_long)in_stack_fffffffffffffe98);
        in_stack_fffffffffffffe98 = (string *)&stack0xfffffffffffffec0;
        absl::substitute_internal::Arg::Arg<std::allocator<char>>
                  ((Arg *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe88);
        format._M_str._7_1_ = in_stack_fffffffffffffedf;
        format._0_15_ = in_stack_fffffffffffffed0;
        absl::Substitute_abi_cxx11_
                  (format,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_RDI);
        uVar3 = std::__cxx11::string::c_str();
        printf("WARNING: %s\n",uVar3);
        std::__cxx11::string::~string(local_a0);
      }
    }
    else if (1 < verbose_level) {
      printf("No label found for vmaddr %lx\n",local_18);
    }
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void RangeSink::AddVMRangeForVMAddr(const char* analyzer,
                                    uint64_t label_from_vmaddr, uint64_t addr,
                                    uint64_t size) {
  bool verbose = IsVerboseForVMRange(addr, size);
  if (verbose) {
    printf("[%s, %s] AddVMRangeForVMAddr(%" PRIx64 ", [%" PRIx64 ", %" PRIx64
           "])\n",
           GetDataSourceLabel(data_source_), analyzer, label_from_vmaddr, addr,
           size);
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->vm_map.TryGetLabel(label_from_vmaddr, &label)) {
      bool ok = pair.first->vm_map.AddRangeWithTranslation(
          addr, size, label, translator_->vm_map, verbose,
          &pair.first->file_map);
      if (!ok && verbose_level > 1) {
        WARN("VM range ($0, $1) for label $2 extends beyond base map", addr,
             size, label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for vmaddr %" PRIx64 "\n", label_from_vmaddr);
    }
  }
}